

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

path * CLI::to_path_abi_cxx11_(string_view str)

{
  path *in_RDI;
  format in_stack_00000027;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000028;
  path *in_stack_00000030;
  
  ::std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (in_stack_00000030,in_stack_00000028,in_stack_00000027);
  return in_RDI;
}

Assistant:

CLI11_INLINE std::filesystem::path to_path(std::string_view str) {
    return std::filesystem::path{
#ifdef _WIN32
        widen(str)
#else
        str
#endif  // _WIN32
    }